

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void LiteScript::Instruction::SaveBinary
               (ostream *stream,
               vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instr)

{
  ulong uVar1;
  ostream *poVar2;
  size_t sVar3;
  char *pcVar4;
  OStreamer OVar5;
  long lVar6;
  OStreamer streamer;
  char local_3f [4];
  char local_3b [3];
  OStreamer local_38;
  
  local_38.stream = stream;
  std::ostream::_M_insert<unsigned_long>((ulong)stream);
  uVar1 = (ulong)((long)(instr->
                        super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(instr->
                       super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar1 != 0) {
    uVar1 = uVar1 & 0xffffffff;
    lVar6 = 8;
    do {
      local_3f[0] = *(char *)((long)(instr->
                                    super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar6 + -8);
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_3f,1);
      switch(*(undefined1 *)
              ((long)(instr->
                     super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar6 + -7)) {
      case 1:
        local_3f[2] = 1;
        std::__ostream_insert<char,std::char_traits<char>>(local_38.stream,local_3f + 2,1);
        local_3f[3] = (&((instr->
                         super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                         )._M_impl.super__Vector_impl_data._M_start)->code)[lVar6];
        pcVar4 = local_3f + 3;
        OVar5.stream = local_38.stream;
        goto LAB_0012c47a;
      case 2:
        local_3b[0] = '\x02';
        std::__ostream_insert<char,std::char_traits<char>>(local_38.stream,local_3b,1);
        OStreamer::operator<<
                  (&local_38,
                   (int *)(&((instr->
                             super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                             )._M_impl.super__Vector_impl_data._M_start)->code + lVar6));
        break;
      case 3:
        local_3b[1] = 3;
        std::__ostream_insert<char,std::char_traits<char>>(local_38.stream,local_3b + 1,1);
        OStreamer::operator<<
                  (&local_38,
                   (float *)(&((instr->
                               super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                               )._M_impl.super__Vector_impl_data._M_start)->code + lVar6));
        break;
      case 4:
        local_3b[2] = 4;
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(stream,local_3b + 2,1);
        pcVar4 = *(char **)(&((instr->
                              super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                              )._M_impl.super__Vector_impl_data._M_start)->code + lVar6);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar3 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
        }
      default:
        pcVar4 = local_3f + 1;
        local_3f[1] = 0;
        OVar5.stream = stream;
LAB_0012c47a:
        std::__ostream_insert<char,std::char_traits<char>>(OVar5.stream,pcVar4,1);
      }
      lVar6 = lVar6 + 0x10;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return;
}

Assistant:

void LiteScript::Instruction::SaveBinary(std::ostream &stream, const std::vector<Instruction> &instr) {
    OStreamer streamer(stream);
    streamer << instr.size();
    for (unsigned int i = 0, sz = instr.size(); i < sz; i++) {
        stream << instr[i].code;
        switch (instr[i].comp_type) {
            case CompType::COMP_TYPE_BOOLEAN:
                streamer << (unsigned char)1 << (unsigned char)instr[i].comp_value.v_boolean;
                break;
            case CompType::COMP_TYPE_INTEGER:
                streamer << (unsigned char)2 << instr[i].comp_value.v_integer;
                break;
            case CompType::COMP_TYPE_FLOAT:
                streamer << (unsigned char)3 << instr[i].comp_value.v_float;
                break;
            case CompType::COMP_TYPE_STRING:
                stream << (unsigned char)4 << instr[i].comp_value.v_string;
            default:
                stream << (unsigned char)0;
        }
    }
}